

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O2

void __thiscall duckdb::MultiFileOptions::AddBatchInfo(MultiFileOptions *this,BindInfo *bind_info)

{
  allocator local_191;
  string local_190;
  string local_170;
  Value local_150;
  Value local_110;
  Value local_d0;
  Value local_90;
  Value local_50;
  
  ::std::__cxx11::string::string((string *)&local_190,"filename",&local_191);
  ::std::__cxx11::string::string((string *)&local_170,(string *)&this->filename_column);
  Value::Value(&local_50,&local_170);
  BindInfo::InsertOption(bind_info,&local_190,&local_50);
  Value::~Value(&local_50);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::string((string *)&local_190,"hive_partitioning",&local_191);
  Value::BOOLEAN(&local_90,this->hive_partitioning);
  BindInfo::InsertOption(bind_info,&local_190,&local_90);
  Value::~Value(&local_90);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::string((string *)&local_190,"auto_detect_hive_partitioning",&local_191);
  Value::BOOLEAN(&local_d0,this->auto_detect_hive_partitioning);
  BindInfo::InsertOption(bind_info,&local_190,&local_d0);
  Value::~Value(&local_d0);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::string((string *)&local_190,"union_by_name",&local_191);
  Value::BOOLEAN(&local_110,this->union_by_name);
  BindInfo::InsertOption(bind_info,&local_190,&local_110);
  Value::~Value(&local_110);
  ::std::__cxx11::string::~string((string *)&local_190);
  ::std::__cxx11::string::string((string *)&local_190,"hive_types_autocast",&local_191);
  Value::BOOLEAN(&local_150,this->hive_types_autocast);
  BindInfo::InsertOption(bind_info,&local_190,&local_150);
  Value::~Value(&local_150);
  ::std::__cxx11::string::~string((string *)&local_190);
  return;
}

Assistant:

void MultiFileOptions::AddBatchInfo(BindInfo &bind_info) const {
	bind_info.InsertOption("filename", Value(filename_column));
	bind_info.InsertOption("hive_partitioning", Value::BOOLEAN(hive_partitioning));
	bind_info.InsertOption("auto_detect_hive_partitioning", Value::BOOLEAN(auto_detect_hive_partitioning));
	bind_info.InsertOption("union_by_name", Value::BOOLEAN(union_by_name));
	bind_info.InsertOption("hive_types_autocast", Value::BOOLEAN(hive_types_autocast));
}